

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameWithClusterInfo.cpp
# Opt level: O2

bool __thiscall
BayesianGameWithClusterInfo::TestExactEquivalence
          (BayesianGameWithClusterInfo *this,Index agI,Index t1,Index t2)

{
  BayesianGameIdenticalPayoff *this_00;
  value_type pJVar1;
  value_type pJVar2;
  ulong __n;
  BayesianGameWithClusterInfo *this_01;
  undefined **ppuVar3;
  bool bVar4;
  bool bVar5;
  char cVar6;
  int iVar7;
  Index IVar8;
  Index IVar9;
  int iVar10;
  undefined4 extraout_var;
  reference pvVar11;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  const_reference ppJVar12;
  undefined8 extraout_XMM0_Qa;
  double dVar13;
  double dVar14;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined1 auVar15 [64];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  BeliefIteratorGeneric bit2;
  BeliefIteratorGeneric bit1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> typeIndices2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> typeIndices;
  double local_b0;
  double local_98;
  undefined **local_90;
  long *local_88;
  undefined8 local_80;
  long *local_78;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_70;
  BayesianGameWithClusterInfo *local_58;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_50;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &(this->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff;
  __n = (ulong)agI;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar7 = (*(this->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff.
            super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase.
            super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
            _vptr_Interface_ProblemToPolicyDiscrete[3])(this_00);
  local_80 = (undefined **)((ulong)local_80._4_4_ << 0x20);
  local_58 = this;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_70,
             CONCAT44(extraout_var,iVar7),(value_type_conflict1 *)&local_80,
             (allocator_type *)&local_90);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,&local_70);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_70);
  auVar15 = ZEXT864(0) << 0x40;
  local_b0 = 0.0;
  local_98 = 0.0;
  local_50 = &(local_58->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff.
              super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase._m_nrTypes;
  bVar4 = false;
  while (bVar4 == false) {
    pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,__n);
    if (*pvVar11 == t1) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_70,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48);
      pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_70,__n);
      *pvVar11 = t2;
      IVar8 = BayesianGameBase::IndividualToJointTypeIndices
                        ((BayesianGameBase *)this_00,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48);
      IVar9 = BayesianGameBase::IndividualToJointTypeIndices
                        ((BayesianGameBase *)this_00,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_70);
      (*(this_00->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
        super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
        _vptr_Interface_ProblemToPolicyDiscrete[0xd])(this_00,(ulong)IVar8);
      dVar13 = auVar15._0_8_;
      (*(this_00->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
        super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
        _vptr_Interface_ProblemToPolicyDiscrete[0xd])(this_00,(ulong)IVar9);
      local_98 = local_98 + dVar13;
      local_b0 = local_b0 + auVar15._0_8_;
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_70);
    }
    bVar4 = IndexTools::Increment
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,local_50);
  }
  iVar7 = (*(this_00->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
            super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
            _vptr_Interface_ProblemToPolicyDiscrete[3])(this_00);
  local_80 = (undefined **)((ulong)local_80 & 0xffffffff00000000);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_70,
             CONCAT44(extraout_var_00,iVar7),(value_type_conflict1 *)&local_80,
             (allocator_type *)&local_90);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,&local_70);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_70);
  bVar5 = true;
  bVar4 = false;
  while ((bVar5 != false && (bVar4 == false))) {
    pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,__n);
    dVar13 = auVar15._0_8_;
    bVar5 = true;
    if (*pvVar11 == t1) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_70,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48);
      pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_70,__n);
      *pvVar11 = t2;
      IVar8 = BayesianGameBase::IndividualToJointTypeIndices
                        ((BayesianGameBase *)this_00,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48);
      IVar9 = BayesianGameBase::IndividualToJointTypeIndices
                        ((BayesianGameBase *)this_00,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_70);
      (*(this_00->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
        super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
        _vptr_Interface_ProblemToPolicyDiscrete[0xd])(this_00,(ulong)IVar8);
      dVar14 = dVar13;
      (*(this_00->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
        super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
        _vptr_Interface_ProblemToPolicyDiscrete[0xd])(this_00,(ulong)IVar9);
      auVar15 = ZEXT864((ulong)(dVar13 / local_98));
      bVar5 = Globals::EqualProbability(dVar13 / local_98,dVar14 / local_b0);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_70);
    }
    bVar4 = IndexTools::Increment
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,local_50);
  }
  if (bVar5 == false) {
    bVar4 = false;
  }
  else {
    iVar7 = (*(this_00->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
              super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
              _vptr_Interface_ProblemToPolicyDiscrete[3])(this_00);
    local_80 = (undefined **)((ulong)local_80 & 0xffffffff00000000);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_70,
               CONCAT44(extraout_var_01,iVar7),(value_type_conflict1 *)&local_80,
               (allocator_type *)&local_90);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,&local_70);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_70);
    local_58 = (BayesianGameWithClusterInfo *)&(local_58->super_BayesianGameForDecPOMDPStage)._m_JBs
    ;
    bVar4 = true;
    bVar5 = false;
    while( true ) {
      if ((bVar5 != false) || (!bVar4)) break;
      pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,__n);
      if (*pvVar11 == t1) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_70,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48);
        pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_70,__n);
        *pvVar11 = t2;
        IVar8 = BayesianGameBase::IndividualToJointTypeIndices
                          ((BayesianGameBase *)this_00,
                           (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48);
        IVar9 = BayesianGameBase::IndividualToJointTypeIndices
                          ((BayesianGameBase *)this_00,
                           (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_70);
        this_01 = local_58;
        ppJVar12 = std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::at
                             ((vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
                               *)local_58,(ulong)IVar8);
        pJVar1 = *ppJVar12;
        ppJVar12 = std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::at
                             ((vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
                               *)this_01,(ulong)IVar9);
        ppuVar3 = local_80;
        if ((pJVar1 != (value_type)0x0) && (pJVar2 = *ppJVar12, pJVar2 != (value_type)0x0)) {
          (*(this_00->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
            super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
            _vptr_Interface_ProblemToPolicyDiscrete[0xd])(this_00,(ulong)IVar8);
          bVar5 = Globals::EqualProbability(auVar15._0_8_,0.0);
          ppuVar3 = local_80;
          if (!bVar5) {
            (*(this_00->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
              super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
              _vptr_Interface_ProblemToPolicyDiscrete[0xd])(this_00,(ulong)IVar9);
            bVar5 = Globals::EqualProbability(auVar15._0_8_,0.0);
            ppuVar3 = local_80;
            if (!bVar5) {
              (**(code **)(*(long *)((long)&pJVar1->field_0x0 + *(long *)((long)*pJVar1 + -0xb8)) +
                          0x98))(&local_80,
                                 (long)&pJVar1->field_0x0 + *(long *)((long)*pJVar1 + -0xb8));
              (**(code **)(*(long *)((long)&pJVar2->field_0x0 + *(long *)((long)*pJVar2 + -0xb8)) +
                          0x98))(&local_90,
                                 (long)&pJVar2->field_0x0 + *(long *)((long)*pJVar2 + -0xb8));
              do {
                iVar7 = (**(code **)(*local_78 + 0x18))();
                iVar10 = (**(code **)(*local_88 + 0x18))();
                auVar15._8_56_ = extraout_var_02;
                auVar15._0_8_ = extraout_XMM0_Qa;
                if (iVar7 != iVar10) {
                  bVar4 = false;
                  break;
                }
                dVar13 = (double)(**(code **)(*local_78 + 0x10))();
                dVar14 = (double)(**(code **)(*local_88 + 0x10))();
                auVar15 = ZEXT864((ulong)dVar13);
                bVar5 = Globals::EqualProbability(dVar13,dVar14);
                if (!bVar5) {
                  bVar4 = false;
                }
                if (!bVar4) break;
                cVar6 = (**(code **)(*local_78 + 0x20))();
                auVar15._8_56_ = extraout_var_03;
                auVar15._0_8_ = extraout_XMM0_Qa_00;
                if (cVar6 == '\0') break;
                cVar6 = (**(code **)(*local_88 + 0x20))();
                auVar15._8_56_ = extraout_var_04;
                auVar15._0_8_ = extraout_XMM0_Qa_01;
              } while (cVar6 != '\0');
              local_90 = &PTR__BeliefIteratorGeneric_005d3870;
              if (local_88 != (long *)0x0) {
                auVar15._0_8_ = (**(code **)(*local_88 + 8))();
                auVar15._8_56_ = extraout_var_05;
              }
              local_80 = &PTR__BeliefIteratorGeneric_005d3870;
              ppuVar3 = &PTR__BeliefIteratorGeneric_005d3870;
              if (local_78 != (long *)0x0) {
                auVar15._0_8_ = (**(code **)(*local_78 + 8))();
                auVar15._8_56_ = extraout_var_06;
                ppuVar3 = local_80;
              }
            }
          }
        }
        local_80 = ppuVar3;
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_70);
      }
      bVar5 = IndexTools::Increment
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,local_50);
    }
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
  return bVar4;
}

Assistant:

bool BayesianGameWithClusterInfo::TestExactEquivalence(Index agI, Index t1, Index t2) const
{
    //looping over all joint type profiles of the other agents
    //( over all type_{-i} ) is inconvenient.
    //Rather we loop over all joint types in this function
    
    //we start with the individual type vector corr. to joint type 0
    //(i.e., the vector with type index 0 for each agent).
    vector<Index> typeIndices;

    //first we compute the marginals P(t1) and P(t2)
    double p1, p2;
    p1 = p2 = 0.0;    
    typeIndices = vector<Index>(GetNrAgents(), 0 );
    bool finished = false;
    bool equalProb=true;

    while( !finished )
    {
        //only if agent agI's component is t1 we do stuff
        if(typeIndices.at(agI) == t1)
        {
            vector<Index> typeIndices2 = typeIndices;
            typeIndices2.at(agI) = t2;
            Index jtI1 = IndividualToJointTypeIndices( typeIndices);
            Index jtI2 = IndividualToJointTypeIndices( typeIndices2);
            p1 += GetProbability(jtI1);
            p2 += GetProbability(jtI2);
        }        
        finished = IndexTools::Increment(typeIndices, _m_nrTypes);
    }



    //now we compare P(type{-i} | t1) =? P(type{-i} | t2)
    typeIndices = vector<Index>(GetNrAgents(), 0 );
    finished = false;
    while( !finished && equalProb )
    {
        //only if agent agI's component is t1 we do stuff
        if(typeIndices.at(agI) == t1)
        {
            vector<Index> typeIndices2 = typeIndices;
            typeIndices2.at(agI) = t2;
            Index jtI1 = IndividualToJointTypeIndices( typeIndices);
            Index jtI2 = IndividualToJointTypeIndices( typeIndices2);
            //cout << "Comparing jtI1="<<jtI1<<"="
                //<<SoftPrintVector(typeIndices);
            //cout << "and jtI2="<<jtI2<<"="
                //<<SoftPrintVector(typeIndices2) << endl;
            double pjt1 =  GetProbability(jtI1);
            double pjt2 =  GetProbability(jtI2);
            double conditional_pjt1 = pjt1 / p1;
            double conditional_pjt2 = pjt2 / p2;
            //cout << "p1="<<p1
                //<<"\t,pjt1="<<pjt1
                //<<"\t,cpjt1="<<conditional_pjt1
                //<<"\np2="<<p2
                //<<"\t,pjt2="<<pjt2
                //<<"\t,cpjt2="<<conditional_pjt2
                //<<endl;
            if(! Globals::EqualProbability(conditional_pjt1,conditional_pjt2 ) )
            {
                equalProb=false;
            }
        }        
        finished = IndexTools::Increment(typeIndices, _m_nrTypes);
    }

#if !BGCLUSTER_OUTPUT_TESTEQUIVALENCE
    // if we want to check why two types are not equivalent, we also
    // need the second test, otherwise we can stop here
    if(!equalProb)
        return(false);
#endif

    //now we compare P(s, type{-i} | t1) =? P(s, type{-i} | t2)
    //or, actually we check that P(s |  type{-i}, t1) =? P(s | type{-i} , t2) 
    typeIndices = vector<Index>(GetNrAgents(), 0 );
    finished = false;
    bool equalJB=true;
    while( !finished && equalJB )
    {
        //only if agent agI's component is t1 we do stuff
        if(typeIndices.at(agI) == t1)
        {
            vector<Index> typeIndices2 = typeIndices;
            typeIndices2.at(agI) = t2;
            Index jtI1 = IndividualToJointTypeIndices( typeIndices);
            Index jtI2 = IndividualToJointTypeIndices( typeIndices2);
            JointBeliefInterface* jb1 = _m_JBs.at(jtI1);
            JointBeliefInterface* jb2 = _m_JBs.at(jtI2);
            // only do this test if the joint beliefs actually exist
            // (they may not in case the joint type has prob 0)
            if(jb1!=0 && jb2!=0 &&
               // If they exist, we still need to check whether can
               // actually occur!
               // In the old code (used for AAMAS09), this check was
               // missing, which is why the recycling problem
               // clustered to 9 JT there, instead of 4 now.
               !Globals::EqualProbability(GetProbability(jtI1),0.0) &&
               !Globals::EqualProbability(GetProbability(jtI2),0.0))
            {
                BeliefIteratorGeneric bit1 = jb1->GetIterator();
                BeliefIteratorGeneric bit2 = jb2->GetIterator();
                do
                {
                    // as the belief can be sparse, we also need to
                    // make sure the iterators point to the same state
                    // index, otherwise beliefs like [0 0 1 0] and [0
                    // 1 0 0] are considered equal
                    if(bit1.GetStateIndex() !=
                       bit2.GetStateIndex())
                        equalJB = false;
                    else
                    {
                        double p1 = bit1.GetProbability();
                        double p2 = bit2.GetProbability();
                        if(! Globals::EqualProbability(p1,p2) )
                            equalJB=false;
                    }
                }
                while(equalJB && bit1.Next() && bit2.Next());
            }
        }        
        finished = IndexTools::Increment(typeIndices, _m_nrTypes);
    }

#if BGCLUSTER_OUTPUT_TESTEQUIVALENCE
    if(!equalProb && !equalJB)
        cout << "TESTEQUIVALENCE " << GetStage() << " notEquivalent both" << endl;
    else if(!equalProb)
        cout << "TESTEQUIVALENCE " << GetStage() << " notEquivalent prob" << endl;
    else if(!equalJB)
        cout << "TESTEQUIVALENCE " << GetStage() << " notEquivalent belief" << endl;
    else
        cout << "TESTEQUIVALENCE " << GetStage() << " equivalent" << endl;
#endif

    if(equalProb && equalJB)
        return(true);
    else
        return(false);
}